

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_Prewitt(PrewittForm4 Prewitt)

{
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  reference pvVar1;
  reference pvVar2;
  reference image_00;
  code *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_fffffffffffffdbc;
  uint8_t in_stack_fffffffffffffdc6;
  uint8_t in_stack_fffffffffffffdc7;
  undefined8 in_stack_fffffffffffffdc8;
  reference in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined8 in_stack_fffffffffffffde0;
  uint32_t height;
  size_type sVar3;
  allocator_type *in_stack_fffffffffffffde8;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffdf0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined8 in_stack_fffffffffffffdf8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  undefined7 in_stack_fffffffffffffe00;
  undefined7 uVar4;
  undefined1 in_stack_fffffffffffffe07;
  uint8_t value;
  value_type y;
  value_type x;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  value_type vVar5;
  uint32_t *in_stack_fffffffffffffe28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe38;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffe40;
  undefined1 **local_188;
  uint local_150;
  uint local_14c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_148;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  undefined1 local_111;
  undefined8 *local_b0;
  undefined1 *local_a8 [5];
  undefined1 local_80 [40];
  undefined8 *local_58;
  undefined8 local_50;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  code *local_18;
  bool local_9;
  
  height = (uint32_t)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  local_18 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffdbc);
  local_111 = 1;
  local_b0 = local_a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_30,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdd0,(uint32_t)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc6
            );
  Test_Helper::uniformImage
            ((uint8_t)((ulong)in_stack_fffffffffffffde8 >> 0x38),(uint32_t)in_stack_fffffffffffffde8
             ,height,(Image *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  local_b0 = (undefined8 *)local_80;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_30,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdd0,(uint32_t)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc6
            );
  Test_Helper::uniformImage
            ((uint8_t)((ulong)in_stack_fffffffffffffde8 >> 0x38),(uint32_t)in_stack_fffffffffffffde8
             ,height,(Image *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  local_111 = 0;
  local_58 = local_a8;
  local_50 = 2;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1e6be6);
  __l._M_len._0_7_ = in_stack_fffffffffffffe00;
  __l._M_array = (iterator)in_stack_fffffffffffffdf8;
  __l._M_len._7_1_ = in_stack_fffffffffffffe07;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(in_stack_fffffffffffffdf0,__l,in_stack_fffffffffffffde8);
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1e6c1a);
  local_188 = (undefined1 **)&local_58;
  do {
    local_188 = local_188 + -5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1e6c4f);
  } while (local_188 != local_a8);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e6c79);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e6c86);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e6c9b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e6cb0);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,
             (uint32_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  if ((local_14c < 3) || (local_150 < 3)) {
    local_9 = true;
  }
  else {
    sVar3 = 0;
    this = &local_48;
    pvVar1 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](this,0);
    this_00 = &local_130;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar3);
    y = *pvVar2;
    this_01 = &local_148;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,sVar3);
    x = *pvVar2;
    uVar4 = 1;
    value = '\0';
    image_00 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[](this,1);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this_00,CONCAT17(value,uVar4));
    vVar5 = *pvVar2;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this_01,CONCAT17(value,uVar4));
    (*local_18)(pvVar1,y,x,image_00,vVar5,*pvVar2,local_14c,local_150);
    sVar3 = 1;
    in_stack_fffffffffffffdd0 =
         std::
         vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
         ::operator[](&local_48,1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_130,sVar3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_148,sVar3);
    local_9 = Unit_Test::verifyImage
                        (image_00,x,y,(uint32_t)((ulong)pvVar1 >> 0x20),(uint32_t)pvVar1,value);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdd0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdd0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_fffffffffffffdd0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdd0);
  return (bool)(local_9 & 1);
}

Assistant:

bool form4_Prewitt(PrewittForm4 Prewitt)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > image = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );
        if ( (roiWidth < 3) || (roiHeight < 3) )
            return true;

        Prewitt( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight );

        return verifyImage( image[1], roiX[1], roiY[1], roiWidth, roiHeight, 0u );
    }